

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O2

CURLcode Curl_rtsp_parseheader(Curl_easy *data,char *header)

{
  uchar *puVar1;
  byte bVar2;
  curl_trc_feat *pcVar3;
  char cVar4;
  int iVar5;
  char *in_RAX;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  CURLcode CVar12;
  byte *src;
  char *pcVar13;
  char *pcVar14;
  size_t length;
  char *endp;
  
  endp = in_RAX;
  iVar5 = curl_strnequal(header,"CSeq:",5);
  if (iVar5 == 0) {
    iVar5 = curl_strnequal(header,"Session:",8);
    if (iVar5 == 0) {
      iVar5 = curl_strnequal(header,"Transport:",10);
      if (iVar5 == 0) {
        return CURLE_OK;
      }
      pcVar13 = header + 10;
      pcVar14 = pcVar13;
      while( true ) {
        if (pcVar14 == (char *)0x0) {
          return CURLE_OK;
        }
        cVar4 = *pcVar14;
        if (cVar4 == '\0') {
          return CURLE_OK;
        }
        while ((cVar4 == ' ' || (cVar4 == '\t'))) {
          pcVar7 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
          cVar4 = *pcVar7;
        }
        pcVar7 = strchr(pcVar14,0x3b);
        iVar5 = curl_strnequal(pcVar14,"interleaved=",0xc);
        if (iVar5 != 0) break;
        pcVar14 = pcVar7 + 1;
        if (pcVar7 == (char *)0x0) {
          pcVar14 = (char *)0x0;
        }
      }
      uVar9 = strtol(pcVar14 + 0xc,&endp,10);
      if (uVar9 < 0x100 && pcVar14 + 0xc != endp) {
        uVar10 = uVar9;
        if (((((*endp == '-') &&
              (pcVar14 = endp + 1, uVar10 = strtol(pcVar14,&endp,10),
              0xff < uVar10 || pcVar14 == endp)) && (uVar10 = uVar9, data != (Curl_easy *)0x0)) &&
            (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          Curl_infof(data,"Unable to read the interleaved parameter from Transport header: [%s]",
                     pcVar13);
        }
        for (; (long)uVar9 <= (long)uVar10; uVar9 = uVar9 + 1) {
          puVar1 = (data->state).rtp_channel_mask + (uVar9 >> 3);
          *puVar1 = *puVar1 | '\x01' << ((byte)uVar9 & 7);
        }
        return CURLE_OK;
      }
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (((data->set).field_0x8cd & 0x10) == 0) {
        return CURLE_OK;
      }
      pcVar3 = (data->state).feat;
      if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
        return CURLE_OK;
      }
      Curl_infof(data,"Unable to read the interleaved parameter from Transport header: [%s]",pcVar13
                );
      return CURLE_OK;
    }
    for (src = (byte *)(header + 8); (bVar2 = *src, bVar2 == 9 || (bVar2 == 0x20)); src = src + 1) {
    }
    if (bVar2 == 0) {
      Curl_failf(data,"Got a blank Session ID");
    }
    else {
      length = 0;
      pbVar11 = src;
      while( true ) {
        pbVar11 = pbVar11 + 1;
        if (((bVar2 < 0x3c) && ((0x800000100000201U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
           (0xfb < (byte)(bVar2 - 0xe))) break;
        bVar2 = *pbVar11;
        length = length + 1;
      }
      pcVar14 = (data->set).str[0x33];
      if (pcVar14 == (char *)0x0) {
        pcVar14 = (char *)Curl_memdup0((char *)src,length);
        (data->set).str[0x33] = pcVar14;
        if (pcVar14 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        return CURLE_OK;
      }
      sVar8 = strlen(pcVar14);
      if ((sVar8 == length) && (iVar5 = strncmp((char *)src,pcVar14,length), iVar5 == 0))
      goto LAB_00148aa2;
      Curl_failf(data,"Got RTSP Session ID Line [%s], but wanted ID [%s]",src,pcVar14);
    }
    CVar12 = CURLE_RTSP_SESSION_ERROR;
  }
  else {
    for (pcVar14 = header + 5; (*pcVar14 == ' ' || (*pcVar14 == '\t')); pcVar14 = pcVar14 + 1) {
    }
    lVar6 = strtol(pcVar14,&endp,10);
    if (pcVar14 == endp) {
      Curl_failf(data,"Unable to read the CSeq header: [%s]",header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    ((data->req).p.rtsp)->CSeq_recv = lVar6;
    (data->state).rtsp_CSeq_recv = lVar6;
LAB_00148aa2:
    CVar12 = CURLE_OK;
  }
  return CVar12;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct Curl_easy *data, const char *header)
{
  if(checkprefix("CSeq:", header)) {
    long CSeq = 0;
    char *endp;
    const char *p = &header[5];
    while(ISBLANK(*p))
      p++;
    CSeq = strtol(p, &endp, 10);
    if(p != endp) {
      struct RTSP *rtsp = data->req.p.rtsp;
      rtsp->CSeq_recv = CSeq; /* mark the request */
      data->state.rtsp_CSeq_recv = CSeq; /* update the handle */
    }
    else {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
  }
  else if(checkprefix("Session:", header)) {
    const char *start, *end;
    size_t idlen;

    /* Find the first non-space letter */
    start = header + 8;
    while(*start && ISBLANK(*start))
      start++;

    if(!*start) {
      failf(data, "Got a blank Session ID");
      return CURLE_RTSP_SESSION_ERROR;
    }

    /* Find the end of Session ID
     *
     * Allow any non whitespace content, up to the field separator or end of
     * line. RFC 2326 is not 100% clear on the session ID and for example
     * gstreamer does url-encoded session ID's not covered by the standard.
     */
    end = start;
    while(*end && *end != ';' && !ISSPACE(*end))
      end++;
    idlen = end - start;

    if(data->set.str[STRING_RTSP_SESSION_ID]) {

      /* If the Session ID is set, then compare */
      if(strlen(data->set.str[STRING_RTSP_SESSION_ID]) != idlen ||
         strncmp(start, data->set.str[STRING_RTSP_SESSION_ID], idlen)) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then set
       * it.
       */

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = Curl_memdup0(start, idlen);
      if(!data->set.str[STRING_RTSP_SESSION_ID])
        return CURLE_OUT_OF_MEMORY;
    }
  }
  else if(checkprefix("Transport:", header)) {
    CURLcode result;
    result = rtsp_parse_transport(data, header + 10);
    if(result)
      return result;
  }
  return CURLE_OK;
}